

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOrder.c
# Opt level: O0

void Aig_ObjOrderInsert(Aig_Man_t *p,int ObjId)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  uint *local_28;
  int nOrderAlloc;
  int iPrev;
  int ObjId_local;
  Aig_Man_t *p_local;
  
  if (ObjId == 0) {
    __assert_fail("ObjId != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                  ,0x62,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
  }
  pObj = Aig_ManObj(p,ObjId);
  iVar2 = Aig_ObjIsNode(pObj);
  if (iVar2 == 0) {
    __assert_fail("Aig_ObjIsNode( Aig_ManObj(p, ObjId) )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                  ,99,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
  }
  if (p->nOrderAlloc <= ObjId) {
    if (p->pOrderData == (uint *)0x0) {
      local_28 = (uint *)malloc((long)(ObjId << 2) << 2);
    }
    else {
      local_28 = (uint *)realloc(p->pOrderData,(long)(ObjId << 2) << 2);
    }
    p->pOrderData = local_28;
    memset(p->pOrderData + (p->nOrderAlloc << 1),0xff,(long)(ObjId * 2 - p->nOrderAlloc) << 3);
    p->nOrderAlloc = ObjId * 2;
  }
  if (p->pOrderData[ObjId << 1] != 0xffffffff) {
    __assert_fail("p->pOrderData[2*ObjId] == 0xFFFFFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                  ,0x6b,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
  }
  if (p->pOrderData[ObjId * 2 + 1] != 0xffffffff) {
    __assert_fail("p->pOrderData[2*ObjId+1] == 0xFFFFFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                  ,0x6c,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
  }
  uVar1 = p->pOrderData[p->iNext << 1];
  if (p->pOrderData[(int)(uVar1 * 2 + 1)] == p->iNext) {
    p->pOrderData[ObjId << 1] = uVar1;
    p->pOrderData[(int)(uVar1 * 2 + 1)] = ObjId;
    p->pOrderData[p->iNext << 1] = ObjId;
    p->pOrderData[ObjId * 2 + 1] = p->iNext;
    p->nAndTotal = p->nAndTotal + 1;
    return;
  }
  __assert_fail("p->pOrderData[2*iPrev+1] == (unsigned)p->iNext",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigOrder.c"
                ,0x6e,"void Aig_ObjOrderInsert(Aig_Man_t *, int)");
}

Assistant:

void Aig_ObjOrderInsert( Aig_Man_t * p, int ObjId )
{
    int iPrev;
    assert( ObjId != 0 );
    assert( Aig_ObjIsNode( Aig_ManObj(p, ObjId) ) );
    if ( ObjId >= p->nOrderAlloc )
    {
        int nOrderAlloc = 2 * ObjId; 
        p->pOrderData = ABC_REALLOC( unsigned, p->pOrderData, 2 * nOrderAlloc );
        memset( p->pOrderData + 2 * p->nOrderAlloc, 0xFF, sizeof(unsigned) * 2 * (nOrderAlloc - p->nOrderAlloc) );
        p->nOrderAlloc = nOrderAlloc;
    }
    assert( p->pOrderData[2*ObjId] == 0xFFFFFFFF );   // prev
    assert( p->pOrderData[2*ObjId+1] == 0xFFFFFFFF ); // next
    iPrev = p->pOrderData[2*p->iNext];
    assert( p->pOrderData[2*iPrev+1] == (unsigned)p->iNext );
    p->pOrderData[2*ObjId] = iPrev;
    p->pOrderData[2*iPrev+1] = ObjId;
    p->pOrderData[2*p->iNext] = ObjId;
    p->pOrderData[2*ObjId+1] = p->iNext;
    p->nAndTotal++;
}